

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConstraintDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConstraintDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::TokenList_const&,slang::parsing::Token&,slang::syntax::NameSyntax&,slang::syntax::ConstraintBlockSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          TokenList *args_1,Token *args_2,NameSyntax *args_3,ConstraintBlockSyntax *args_4)

{
  Token keyword;
  ConstraintDeclarationSyntax *this_00;
  ConstraintBlockSyntax *args_local_4;
  NameSyntax *args_local_3;
  Token *args_local_2;
  TokenList *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ConstraintDeclarationSyntax *)allocate(this,0x90,8);
  keyword.kind = args_2->kind;
  keyword._2_1_ = args_2->field_0x2;
  keyword.numFlags.raw = (args_2->numFlags).raw;
  keyword.rawLen = args_2->rawLen;
  keyword.info = args_2->info;
  slang::syntax::ConstraintDeclarationSyntax::ConstraintDeclarationSyntax
            (this_00,args,args_1,keyword,args_3,args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }